

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwStatAlloc(size_t size,char *file,int line)

{
  mwStat *pmVar1;
  mwStat *ms;
  int line_local;
  char *file_local;
  size_t size_local;
  
  pmVar1 = mwStatGet(file,-1,1);
  if (pmVar1 != (mwStat *)0x0) {
    pmVar1->total = size + pmVar1->total;
    pmVar1->curr = size + pmVar1->curr;
    pmVar1->num = pmVar1->num + 1;
    if (pmVar1->max < pmVar1->curr) {
      pmVar1->max = pmVar1->curr;
    }
  }
  if ((((1 < mwStatLevel) && (line != -1)) && (file != (char *)0x0)) &&
     (pmVar1 = mwStatGet(file,line,1), pmVar1 != (mwStat *)0x0)) {
    pmVar1->total = size + pmVar1->total;
    pmVar1->curr = size + pmVar1->curr;
    pmVar1->num = pmVar1->num + 1;
    if (pmVar1->max < pmVar1->curr) {
      pmVar1->max = pmVar1->curr;
    }
  }
  return;
}

Assistant:

static void mwStatAlloc(size_t size, const char *file, int line)
{
	mwStat *ms;

	/* update the module statistics */
	ms = mwStatGet(file, -1, 1);
	if (ms != NULL) {
		ms->total += (long) size;
		ms->curr += (long) size;
		ms->num ++;
		if (ms->curr > ms->max) {
			ms->max = ms->curr;
		}
	}

	/* update the line statistics */
	if (mwStatLevel > 1 && line != -1 && file) {
		ms = mwStatGet(file, line, 1);
		if (ms != NULL) {
			ms->total += (long) size;
			ms->curr += (long) size;
			ms->num ++;
			if (ms->curr > ms->max) {
				ms->max = ms->curr;
			}
		}
	}

}